

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O1

void __thiscall
duckdb::CheckpointReader::ReadIndex
          (CheckpointReader *this,CatalogTransaction transaction,Deserializer *deserializer)

{
  Catalog *this_00;
  pointer pIVar1;
  _func_int *__n;
  CatalogTransaction transaction_00;
  size_type sVar2;
  optional_ptr<duckdb::CatalogEntry,_true> oVar3;
  shared_ptr<duckdb::DataTableInfo,_true> *this_01;
  undefined8 uVar4;
  int iVar5;
  pointer pCVar6;
  pointer pCVar7;
  SchemaCatalogEntry *this_02;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DataTableInfo *pDVar8;
  type args_2;
  IOException *this_03;
  pointer pIVar9;
  bool bVar10;
  BlockPointer BVar11;
  templated_unique_single_t unbound_index;
  optional_ptr<duckdb::CatalogEntry,_true> catalog_table;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_130;
  UnboundIndex *local_128;
  _Head_base<0UL,_duckdb::Index_*,_false> local_120;
  size_type local_118;
  optional_ptr<duckdb::CatalogEntry,_true> local_110;
  long local_108;
  shared_ptr<duckdb::DataTableInfo,_true> *local_100;
  DatabaseInstance *local_f8;
  ClientContext *pCStack_f0;
  Transaction *local_e8;
  transaction_t tStack_e0;
  transaction_t local_d8;
  undefined1 local_d0 [32];
  undefined1 local_b0 [8];
  undefined1 local_a8 [40];
  size_t local_80;
  _Alloc_hider _Stack_78;
  undefined1 local_70 [24];
  vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  vStack_58;
  size_type local_40;
  undefined8 uStack_38;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"index");
  local_130._M_head_impl = (CreateInfo *)0x0;
  iVar5 = (*deserializer->_vptr_Deserializer[10])(deserializer);
  if ((char)iVar5 != '\0') {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    CreateInfo::Deserialize((CreateInfo *)local_d0,deserializer);
    local_130._M_head_impl = (CreateInfo *)local_d0._0_8_;
    (*deserializer->_vptr_Deserializer[7])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[0xb])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  pCVar6 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)&local_130);
  iVar5 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"root_block_pointer");
  if ((char)iVar5 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    BVar11 = (BlockPointer)ZEXT816(0xffffffffffffffff);
  }
  else {
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    BVar11 = BlockPointer::Deserialize(deserializer);
    (*deserializer->_vptr_Deserializer[7])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  local_118 = BVar11.block_id;
  this_00 = this->catalog;
  local_d8 = transaction.start_time;
  local_f8 = (DatabaseInstance *)transaction.db.ptr;
  pCStack_f0 = (ClientContext *)transaction.context.ptr;
  local_e8 = (Transaction *)transaction.transaction.ptr;
  tStack_e0 = transaction.transaction_id;
  pCVar7 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                       *)&local_130);
  transaction_00.context.ptr._0_4_ = (int)pCStack_f0;
  transaction_00.db.ptr = local_f8;
  transaction_00.context.ptr._4_4_ = (int)((ulong)pCStack_f0 >> 0x20);
  transaction_00.transaction.ptr._0_4_ = (int)local_e8;
  transaction_00.transaction.ptr._4_4_ = (int)((ulong)local_e8 >> 0x20);
  transaction_00.transaction_id._0_4_ = (int)tStack_e0;
  transaction_00.transaction_id._4_4_ = (int)(tStack_e0 >> 0x20);
  transaction_00.start_time = local_d8;
  this_02 = Catalog::GetSchema(this_00,transaction_00,&pCVar7->schema);
  local_110 = SchemaCatalogEntry::GetEntry(this_02,transaction,TABLE_ENTRY,(string *)(pCVar6 + 1));
  if (local_110.ptr == (CatalogEntry *)0x0) {
    this_03 = (IOException *)__cxa_allocate_exception(0x10);
    local_d0._0_8_ = local_d0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"corrupt database file - index entry without table entry","");
    IOException::IOException(this_03,(string *)local_d0);
    __cxa_throw(this_03,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_110);
  oVar3.ptr = local_110.ptr;
  if (pCVar6[1].dependencies.set._M_h._M_bucket_count == 0) {
    ::std::__cxx11::string::_M_replace((ulong)&pCVar6[1].dependencies,0,(char *)0x0,0x13b2393);
  }
  iVar5 = (*(this_02->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x12])
                    (this_02,pCVar6,oVar3.ptr);
  local_d0._0_8_ = CONCAT44(extraout_var,iVar5);
  optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
            ((optional_ptr<duckdb::CatalogEntry,_true> *)local_d0);
  uVar4 = local_d0._0_8_;
  iVar5 = (*(oVar3.ptr)->_vptr_CatalogEntry[0x10])(oVar3.ptr);
  sVar2 = local_118;
  local_108 = CONCAT44(extraout_var_00,iVar5);
  local_100 = (shared_ptr<duckdb::DataTableInfo,_true> *)(local_108 + 0x18);
  local_d0._0_8_ = local_d0 + 0x10;
  local_d0._8_8_ = 0;
  local_d0[0x10] = '\0';
  local_a8._0_8_ = &_Stack_78;
  local_a8._8_8_ = &DAT_00000001;
  local_a8._16_8_ = (_Hash_node_base *)0x0;
  local_a8._24_8_ = 0;
  local_a8._32_4_ = 0x3f800000;
  local_80 = 0;
  _Stack_78._M_p = (pointer)0x0;
  local_70._0_8_ = (pointer)0x0;
  local_70._8_8_ = 0;
  local_70._16_8_ = 0;
  vStack_58.
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_58.
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_58.
  super__Vector_base<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40 = 0xffffffffffffffff;
  uStack_38._0_4_ = 0.0;
  uStack_38._4_4_ = 0;
  if (local_118 == 0xffffffffffffffff) {
    pDVar8 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(local_100);
    pIVar9 = (pDVar8->index_storage_infos).
             super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
             super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pIVar1 = (pDVar8->index_storage_infos).
             super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
             super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pIVar9 != pIVar1) {
      do {
        while( true ) {
          __n = (_func_int *)(pIVar9->name)._M_string_length;
          if (__n == *(_func_int **)(uVar4 + 0x28)) {
            if (__n == (_func_int *)0x0) {
              bVar10 = true;
            }
            else {
              iVar5 = bcmp((pIVar9->name)._M_dataplus._M_p,*(_func_int **)(uVar4 + 0x20),(size_t)__n
                          );
              bVar10 = iVar5 == 0;
            }
          }
          else {
            bVar10 = false;
          }
          if (!bVar10) break;
          ::std::__cxx11::string::_M_assign((string *)local_d0);
          local_b0 = (undefined1  [8])pIVar9->root;
          if (pIVar9 != (pointer)local_d0) {
            ::std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_a8,&(pIVar9->options)._M_h);
          }
          ::std::
          vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>::
          operator=((vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
                     *)local_70,
                    &(pIVar9->allocator_infos).
                     super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
                   );
          ::std::
          vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
          ::operator=(&vStack_58,
                      &(pIVar9->buffers).
                       super_vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
                     );
          local_40 = (pIVar9->root_block_ptr).block_id;
          uStack_38._0_4_ = (float)(pIVar9->root_block_ptr).offset;
          uStack_38._4_4_ = (pIVar9->root_block_ptr).unused_padding;
          pIVar9 = pIVar9 + 1;
          if (bVar10 || pIVar9 == pIVar1) goto LAB_00647cb2;
        }
        pIVar9 = pIVar9 + 1;
      } while (pIVar9 != pIVar1);
    }
  }
  else {
    ::std::__cxx11::string::_M_assign((string *)local_d0);
    local_40 = sVar2;
    uStack_38 = BVar11._8_8_;
  }
LAB_00647cb2:
  this_01 = local_100;
  pDVar8 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(local_100);
  args_2 = shared_ptr<duckdb::TableIOManager,_true>::operator*(&pDVar8->table_io_manager);
  make_uniq<duckdb::UnboundIndex,duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,duckdb::IndexStorageInfo&,duckdb::TableIOManager&,duckdb::AttachedDatabase&>
            ((duckdb *)&local_128,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             &local_130,(IndexStorageInfo *)local_d0,args_2,*(AttachedDatabase **)(local_108 + 0x10)
            );
  pDVar8 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_01);
  local_120._M_head_impl = &local_128->super_Index;
  local_128 = (UnboundIndex *)0x0;
  TableIndexList::AddIndex
            (&pDVar8->indexes,
             (unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true> *)&local_120);
  if (local_120._M_head_impl != (Index *)0x0) {
    (*(local_120._M_head_impl)->_vptr_Index[1])();
  }
  local_120._M_head_impl = (Index *)0x0;
  if (local_128 != (UnboundIndex *)0x0) {
    ::std::default_delete<duckdb::UnboundIndex>::operator()
              ((default_delete<duckdb::UnboundIndex> *)&local_128,local_128);
  }
  ::std::
  vector<duckdb::vector<duckdb::IndexBufferInfo,_true>,_std::allocator<duckdb::vector<duckdb::IndexBufferInfo,_true>_>_>
  ::~vector(&vStack_58);
  ::std::vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>::
  ~vector((vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_> *
          )local_70);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_a8);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_);
  }
  if (local_130._M_head_impl != (CreateInfo *)0x0) {
    (*((local_130._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  return;
}

Assistant:

void CheckpointReader::ReadIndex(CatalogTransaction transaction, Deserializer &deserializer) {
	// we need to keep the tag "index", even though it is slightly misleading.
	auto create_info = deserializer.ReadProperty<unique_ptr<CreateInfo>>(100, "index");
	auto &info = create_info->Cast<CreateIndexInfo>();

	// also, we have to read the root_block_pointer, which will not be valid for newer storage versions.
	// This leads to different code paths in this function.
	auto root_block_pointer =
	    deserializer.ReadPropertyWithExplicitDefault<BlockPointer>(101, "root_block_pointer", BlockPointer());

	// create the index in the catalog

	// look for the table in the catalog
	auto &schema = catalog.GetSchema(transaction, create_info->schema);
	auto catalog_table = schema.GetEntry(transaction, CatalogType::TABLE_ENTRY, info.table);
	if (!catalog_table) {
		// See internal issue 3663.
		throw IOException("corrupt database file - index entry without table entry");
	}
	auto &table = catalog_table->Cast<DuckTableEntry>();

	// we also need to make sure the index type is loaded
	// backwards compatibility:
	// if the index type is not specified, we default to ART
	if (info.index_type.empty()) {
		info.index_type = ART::TYPE_NAME;
	}

	// now we can look for the index in the catalog and assign the table info
	auto &index = schema.CreateIndex(transaction, info, table)->Cast<DuckIndexEntry>();
	auto &data_table = table.GetStorage();
	auto &table_info = data_table.GetDataTableInfo();

	IndexStorageInfo index_storage_info;
	if (root_block_pointer.IsValid()) {
		// Read older duckdb files.
		index_storage_info.name = index.name;
		index_storage_info.root_block_ptr = root_block_pointer;

	} else {
		// Read the matching index storage info.
		for (auto const &elem : table_info->GetIndexStorageInfo()) {
			if (elem.name == index.name) {
				index_storage_info = elem;
				break;
			}
		}
	}

	D_ASSERT(index_storage_info.IsValid());
	D_ASSERT(!index_storage_info.name.empty());

	// Create an unbound index and add it to the table.
	auto unbound_index = make_uniq<UnboundIndex>(std::move(create_info), index_storage_info,
	                                             TableIOManager::Get(data_table), data_table.db);
	table_info->GetIndexes().AddIndex(std::move(unbound_index));
}